

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * __thiscall
kj::Path::evalWin32Impl
          (Path *__return_storage_ptr__,Path *this,Vector<kj::String> *parts,StringPtr path,
          bool fromApi)

{
  String *pSVar1;
  String *pSVar2;
  Path *pPVar3;
  byte bVar4;
  size_t sVar5;
  bool bVar6;
  char *c;
  long lVar7;
  size_t extraout_RDX;
  char (*params) [3];
  Path *this_00;
  char *pcVar8;
  char *pcVar9;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> part_00;
  StringPtr value;
  ArrayPtr<const_char> part_01;
  ArrayPtr<const_char> part_02;
  StringPtr local_98;
  DebugExpression<bool> _kjCondition;
  Fault f;
  String ownPath;
  Array<kj::String> local_48;
  __off_t __length;
  
  pcVar9 = path.content.ptr;
  bVar4 = (byte)path.content.size_;
  ownPath.content.ptr = (char *)0x0;
  ownPath.content.size_ = 0;
  ownPath.content.disposer = (ArrayDisposer *)0x0;
  local_98.content.ptr = (char *)parts;
  local_98.content.size_ = (size_t)pcVar9;
  if ((int)path.content.size_ == 0) {
    StringPtr::findFirst((StringPtr *)&f,(char)&local_98);
    if ((char)f.exception != '\0') {
      value.content.size_ = (size_t)pcVar9;
      value.content.ptr = (char *)local_98.content.size_;
      heapString((String *)&f,(kj *)local_98.content.ptr,value);
      Array<char>::operator=(&ownPath.content,(Array<char> *)&f);
      Array<char>::~Array((Array<char> *)&f);
      pcVar9 = ownPath.content.ptr + (ownPath.content.size_ - 1);
      pcVar8 = ownPath.content.ptr;
      if (ownPath.content.size_ == 0) {
        pcVar8 = (char *)0x0;
        pcVar9 = (char *)0x0;
      }
      for (; pcVar8 != pcVar9; pcVar8 = pcVar8 + 1) {
        if (*pcVar8 == '/') {
          *pcVar8 = '\\';
        }
      }
      local_98.content.ptr = ownPath.content.ptr;
      if (ownPath.content.size_ == 0) {
        local_98.content.ptr = (char *)(kj *)0x1e847a;
      }
      local_98.content.size_ = ownPath.content.size_ + (ownPath.content.size_ == 0);
    }
LAB_001d20ae:
    f.exception = (Exception *)anon_var_dwarf_2f44c7;
    bVar6 = StringPtr::startsWith(&local_98,(StringPtr *)&f);
    if (bVar6) {
      local_98.content.ptr = local_98.content.ptr + 2;
      local_98.content.size_ = local_98.content.size_ + -2;
    }
    else {
      f.exception = (Exception *)0x1fef79;
      bVar6 = StringPtr::startsWith(&local_98,(StringPtr *)&f);
      if (bVar6) {
        _kjCondition.value = (bool)(bVar4 ^ 1);
        if (bVar4 != 0) {
          _::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[39]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x17b,FAILED,"!fromApi",
                     "_kjCondition,\"parseWin32Api() requires absolute path\"",&_kjCondition,
                     (char (*) [39])"parseWin32Api() requires absolute path");
          _::Debug::Fault::fatal(&f);
        }
        pSVar1 = (this->parts).ptr;
        pSVar2 = (String *)(this->parts).size_;
        lVar7 = (long)pSVar2 - (long)pSVar1;
        part.size_ = lVar7 % 0x18;
        if (pSVar2 == pSVar1) {
LAB_001d22ae:
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::StringPtr&>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x186,FAILED,(char *)0x0,"\"must specify drive letter\", path",
                     (char (*) [26])"must specify drive letter",&local_98);
          ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
          str<char_const(&)[3]>((String *)&f,(kj *)"c:",params);
          Vector<kj::String>::add<kj::String>((Vector<kj::String> *)this,(String *)&f);
          Array<char>::~Array((Array<char> *)&f);
          _::Debug::Fault::~Fault((Fault *)&_kjCondition);
        }
        else {
          pPVar3 = (Path *)(pSVar1->content).size_;
          this_00 = pPVar3;
          if (pPVar3 != (Path *)0x0) {
            this_00 = (Path *)(pSVar1->content).ptr;
          }
          pcVar9 = (char *)0x0;
          if (pPVar3 != (Path *)0x0) {
            pcVar9 = (char *)((long)&pPVar3[-1].parts.disposer + 7);
          }
          part.ptr = pcVar9;
          bVar6 = isWin32Drive(this_00,part);
          if (bVar6) {
            pcVar9 = (char *)0x1;
          }
          else {
            if ((ulong)(lVar7 / 0x18) < 2) goto LAB_001d22ae;
            pcVar9 = (char *)0x2;
          }
          ArrayBuilder<kj::String>::truncate((ArrayBuilder<kj::String> *)this,pcVar9,__length);
        }
        goto LAB_001d20e8;
      }
      if ((((char *)(local_98.content.size_ + -1) != (char *)0x2) &&
          (((char *)(local_98.content.size_ + -1) < (char *)0x3 ||
           (*(kj *)(local_98.content.ptr + 2) != (kj)0x5c)))) ||
         (part_00.size_ = extraout_RDX, part_00.ptr = (char *)0x2,
         bVar6 = isWin32Drive((Path *)local_98.content.ptr,part_00), !bVar6)) {
        _kjCondition.value = (bool)(bVar4 ^ 1);
        if (_kjCondition.value == false) {
          _::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[39]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x192,FAILED,"!fromApi",
                     "_kjCondition,\"parseWin32Api() requires absolute path\"",&_kjCondition,
                     (char (*) [39])"parseWin32Api() requires absolute path");
          _::Debug::Fault::fatal(&f);
        }
        goto LAB_001d20e8;
      }
    }
  }
  else {
    f.exception = (Exception *)anon_var_dwarf_309c2a;
    bVar6 = StringPtr::startsWith(&local_98,(StringPtr *)&f);
    if (!bVar6) goto LAB_001d20ae;
    local_98.content.ptr = local_98.content.ptr + 4;
    local_98.content.size_ = local_98.content.size_ + -4;
    f.exception = (Exception *)anon_var_dwarf_309c41;
    bVar6 = StringPtr::startsWith(&local_98,(StringPtr *)&f);
    if (bVar6) {
      local_98.content.ptr = local_98.content.ptr + 4;
      local_98.content.size_ = local_98.content.size_ + -4;
    }
  }
  ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
LAB_001d20e8:
  sVar5 = local_98.content.size_;
  pcVar9 = (char *)0x0;
  do {
    pcVar8 = (char *)0x0;
    while( true ) {
      part_01.size_ = pcVar8 + (long)(pcVar9 + (1 - sVar5));
      if (part_01.size_ == (char *)0x0) {
        part_02.size_ = 0;
        part_02.ptr = (char *)(local_98.content.size_ + ~(ulong)pcVar9);
        evalPart(this,(Vector<kj::String> *)(local_98.content.ptr + (long)pcVar9),part_02);
        Vector<kj::String>::releaseAsArray(&local_48,(Vector<kj::String> *)this);
        (__return_storage_ptr__->parts).ptr = local_48.ptr;
        (__return_storage_ptr__->parts).size_ = local_48.size_;
        (__return_storage_ptr__->parts).disposer = local_48.disposer;
        local_48.ptr = (String *)0x0;
        local_48.size_ = 0;
        Array<kj::String>::~Array(&local_48);
        Array<char>::~Array(&ownPath.content);
        return __return_storage_ptr__;
      }
      if (((kj *)(local_98.content.ptr + (long)pcVar9))[(long)pcVar8] == (kj)0x5c) break;
      pcVar8 = pcVar8 + 1;
    }
    part_01.ptr = pcVar8;
    evalPart(this,(Vector<kj::String> *)(local_98.content.ptr + (long)pcVar9),part_01);
    pcVar9 = pcVar8 + (long)(pcVar9 + 1);
  } while( true );
}

Assistant:

Path Path::evalWin32Impl(Vector<String>&& parts, StringPtr path, bool fromApi) {
  // Convert all forward slashes to backslashes.
  String ownPath;
  if (!fromApi && path.findFirst('/') != kj::none) {
    ownPath = heapString(path);
    for (char& c: ownPath) {
      if (c == '/') c = '\\';
    }
    path = ownPath;
  }

  // Interpret various forms of absolute paths.
  if (fromApi && path.startsWith("\\\\?\\")) {
    path = path.slice(4);
    if (path.startsWith("UNC\\")) {
      path = path.slice(4);
    }

    // The path is absolute.
    parts.clear();
  } else if (path.startsWith("\\\\")) {
    // UNC path.
    path = path.slice(2);

    // This path is absolute. The first component is a server name.
    parts.clear();
  } else if (path.startsWith("\\")) {
    KJ_REQUIRE(!fromApi, "parseWin32Api() requires absolute path");

    // Path is relative to the current drive / network share.
    if (parts.size() >= 1 && isWin32Drive(parts[0])) {
      // Leading \ interpreted as root of current drive.
      parts.truncate(1);
    } else if (parts.size() >= 2) {
      // Leading \ interpreted as root of current network share (which is indicated by the first
      // *two* components of the path).
      parts.truncate(2);
    } else {
      KJ_FAIL_REQUIRE("must specify drive letter", path) {
        // Recover by assuming C drive.
        parts.clear();
        parts.add(kj::str("c:"));
        break;
      }
    }
  } else if ((path.size() == 2 || (path.size() > 2 && path[2] == '\\')) &&
             isWin32Drive(path.first(2))) {
    // Starts with a drive letter.
    parts.clear();
  } else {
    KJ_REQUIRE(!fromApi, "parseWin32Api() requires absolute path");
  }

  size_t partStart = 0;
  for (auto i: kj::indices(path)) {
    if (path[i] == '\\') {
      evalPart(parts, path.slice(partStart, i));
      partStart = i + 1;
    }
  }
  evalPart(parts, path.slice(partStart));

  return Path(parts.releaseAsArray(), Path::ALREADY_CHECKED);
}